

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O0

void __thiscall ReportAsync::ReportAsync(ReportAsync *this)

{
  undefined8 *in_RDI;
  Reporter *in_stack_ffffffffffffffd0;
  condition_variable *this_00;
  Reporter *in_stack_ffffffffffffffe8;
  AutoThreadCrosser *in_stack_fffffffffffffff0;
  
  Reporter::Reporter(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__ReportAsync_00115c38;
  *(undefined1 *)(in_RDI + 1) = 0;
  std::mutex::mutex((mutex *)0x10c564);
  this_00 = (condition_variable *)(in_RDI + 7);
  std::condition_variable::condition_variable(this_00);
  std::
  queue<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::deque<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  queue<std::deque<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,void>
            ((queue<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)this_00);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)this_00);
  capture_thread::ThreadCapture<Reporter>::AutoThreadCrosser::AutoThreadCrosser
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ReportAsync() : cross_and_capture_to_(this) {}